

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::advance
          (SimpleParser<avro::parsing::JsonHandler> *this,Kind k)

{
  bool bVar1;
  Kind KVar2;
  non_const_type puVar3;
  undefined8 uVar4;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar5;
  ostream *poVar6;
  char *pcVar7;
  Exception *this_00;
  JsonHandler *this_01;
  Kind in_ESI;
  Decoder *in_stack_00000038;
  SimpleParser<avro::parsing::JsonHandler> *in_stack_00000040;
  ostringstream oss;
  size_t n;
  Kind result;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *p_1;
  RepeaterInfo *p;
  ProductionPtr pp_1;
  ProductionPtr pp;
  Symbol *s;
  string *in_stack_fffffffffffffd58;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *in_stack_fffffffffffffd60;
  ProductionPtr *in_stack_fffffffffffffd78;
  ostringstream *this_02;
  SimpleParser<avro::parsing::JsonHandler> *in_stack_fffffffffffffd80;
  Symbol *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffdc8;
  SimpleParser<avro::parsing::JsonHandler> *in_stack_fffffffffffffdd0;
  ostringstream local_220 [336];
  Kind in_stack_ffffffffffffff30;
  Kind in_stack_ffffffffffffff34;
  Symbol local_30;
  Symbol *local_20;
  Kind local_14;
  
  local_14 = in_ESI;
  do {
    while( true ) {
      local_20 = std::
                 stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                        *)0x2a5011);
      KVar2 = Symbol::kind(local_20);
      if (KVar2 == local_14) {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x2a503d);
        return local_14;
      }
      bVar1 = Symbol::isTerminal(local_20);
      if (!bVar1) break;
      Symbol::kind(local_20);
      throwMismatch(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    }
    KVar2 = Symbol::kind(local_20);
    this_01 = (JsonHandler *)(ulong)(KVar2 - sRoot);
    switch(this_01) {
    case (JsonHandler *)0x0:
      Symbol::
      extrap<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                ((Symbol *)0x2a50cd);
      boost::tuples::
      get<0,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>
                ((cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>
                  *)0x2a50d5);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      break;
    case (JsonHandler *)0x1:
      Symbol::
      extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                ((Symbol *)0x2a5220);
      puVar3 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x2a5235);
      *puVar3 = *puVar3 - 1;
      boost::tuples::
      get<2,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                  *)0x2a524c);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      break;
    default:
      bVar1 = Symbol::isImplicitAction(local_20);
      if (!bVar1) {
        this_02 = local_220;
        std::__cxx11::ostringstream::ostringstream(this_02);
        poVar6 = std::operator<<((ostream *)this_02,"Encountered ");
        KVar2 = Symbol::kind(local_20);
        pcVar7 = Symbol::toString(KVar2);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6," while looking for ");
        pcVar7 = Symbol::toString(local_14);
        std::operator<<(poVar6,pcVar7);
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        std::__cxx11::ostringstream::str();
        Exception::Exception(this_00,in_stack_fffffffffffffd58);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      JsonHandler::handle(this_01,in_stack_fffffffffffffd98);
      KVar2 = Symbol::kind(local_20);
      if (KVar2 == sWriterUnion) {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x2a53e6);
        selectBranch(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      }
      else {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x2a5408);
      }
      break;
    case (JsonHandler *)0x4:
      in_stack_fffffffffffffd98 = &local_30;
      Symbol::
      extra<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((Symbol *)in_stack_fffffffffffffd58);
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x2a510f);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x2a512d);
      break;
    case (JsonHandler *)0x5:
      Symbol::
      extra<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((Symbol *)in_stack_fffffffffffffd58);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                (in_stack_fffffffffffffd60,
                 (weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                  *)in_stack_fffffffffffffd58);
      boost::weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
      ~weak_ptr((weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x2a5193);
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x2a51a1);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x2a51c2);
      break;
    case (JsonHandler *)0x8:
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x2a5383);
      skip(in_stack_00000040,in_stack_00000038);
      break;
    case (JsonHandler *)0x9:
      ppVar5 = Symbol::extrap<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         ((Symbol *)0x2a5324);
      assertMatch(sTerminalLow,0x2a5343);
      KVar2 = ppVar5->first;
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x2a5362);
      return KVar2;
    case (JsonHandler *)0x14:
      uVar4 = __cxa_allocate_exception(0x18);
      Symbol::extra<std::__cxx11::string>((Symbol *)in_stack_fffffffffffffd58);
      Exception::Exception((Exception *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }